

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  GestureEvent event;
  undefined1 auVar1 [48];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  
  CORE.Input.Mouse.currentButtonState[button] = (char)action;
  uVar4 = 0;
  if (((char)action == '\x01') && (CORE.Input.Mouse.previousButtonState[button] == '\0')) {
    uVar4 = 1;
  }
  auVar2._0_4_ = CORE.Input.Mouse.scale.x *
                 (CORE.Input.Mouse.offset.x + CORE.Input.Mouse.position.x);
  auVar2._4_4_ = CORE.Input.Mouse.scale.y *
                 (CORE.Input.Mouse.offset.y + CORE.Input.Mouse.position.y);
  auVar2._8_8_ = 0;
  auVar3._4_4_ = (float)(int)CORE.Window.currentFbo.height;
  auVar3._0_4_ = (float)(int)CORE.Window.currentFbo.width;
  auVar3._8_8_ = 0;
  auVar3 = divps(auVar2,auVar3);
  auVar1 = ZEXT3248(CONCAT428(1,CONCAT424(uVar4,CONCAT816(in_stack_ffffffffffffffc0,ZEXT816(0)))));
  event.position[3] = auVar3._0_8_;
  event.touchAction = auVar1._0_4_;
  event.pointCount = auVar1._4_4_;
  event.pointerId[0] = auVar1._8_4_;
  event.pointerId[1] = auVar1._12_4_;
  event.pointerId[2] = auVar1._16_4_;
  event.pointerId[3] = auVar1._20_4_;
  event.position[0].x = (float)(int)auVar1._24_8_;
  event.position[0].y = (float)(int)((ulong)auVar1._24_8_ >> 0x20);
  event.position[1].x = (float)(int)auVar1._32_8_;
  event.position[1].y = (float)(int)((ulong)auVar1._32_8_ >> 0x20);
  event.position[2].x = (float)(int)auVar1._40_8_;
  event.position[2].y = (float)(int)((ulong)auVar1._40_8_ >> 0x20);
  ProcessGestureEvent(event);
  return;
}

Assistant:

static void MouseButtonCallback(GLFWwindow *window, int button, int action, int mods)
{
    // WARNING: GLFW could only return GLFW_PRESS (1) or GLFW_RELEASE (0) for now,
    // but future releases may add more actions (i.e. GLFW_REPEAT)
    CORE.Input.Mouse.currentButtonState[button] = action;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    // Register touch actions
    if ((CORE.Input.Mouse.currentButtonState[button] == 1) && (CORE.Input.Mouse.previousButtonState[button] == 0)) gestureEvent.touchAction = TOUCH_DOWN;
    else if ((CORE.Input.Mouse.currentButtonState[button] == 0) && (CORE.Input.Mouse.previousButtonState[button] == 1)) gestureEvent.touchAction = TOUCH_UP;

    // NOTE: TOUCH_MOVE event is registered in MouseCursorPosCallback()

    // Assign a pointer ID
    gestureEvent.pointerId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = GetMousePosition();

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}